

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nva.c
# Opt level: O0

nva_card * nva_init_gpu(pci_device *dev)

{
  int iVar1;
  uint32_t pmc_id_00;
  undefined8 uVar2;
  pciaddr_t pVar3;
  int local_28;
  uint32_t pmc_id;
  int iobar;
  int ret;
  nva_card *card;
  pci_device *dev_local;
  
  dev_local = (pci_device *)calloc(0x90,1);
  if (dev_local == (pci_device *)0x0) {
    dev_local = (pci_device *)0x0;
  }
  else {
    dev_local->domain_16 = 0;
    dev_local->bus = '\0';
    dev_local->dev = '\0';
    dev_local->func = '\0';
    dev_local->field_0x5 = 0;
    dev_local->vendor_id = 0;
    *(pci_device **)&dev_local->device_id = dev;
    iVar1 = pci_device_map_range
                      (dev,dev->regions[0].base_addr,dev->regions[0].size,1,
                       &dev_local->regions[0].size);
    if (iVar1 == 0) {
      *(pciaddr_t *)&dev_local->regions[0].field_0x20 = dev->regions[0].size;
      if (dev->regions[1].size != 0) {
        *(undefined4 *)&dev_local->regions[1].memory = 1;
        dev_local->regions[1].base_addr = dev->regions[1].size;
        iVar1 = pci_device_map_range
                          (dev,dev->regions[1].base_addr,dev->regions[1].size,1,
                           &dev_local->regions[1].bus_addr);
        if (iVar1 != 0) {
          dev_local->regions[1].bus_addr = 0;
        }
      }
      if ((dev->regions[2].size == 0) || ((dev->regions[2].field_0x20 & 1) != 0)) {
        if (dev->regions[3].size != 0) {
          *(undefined4 *)&dev_local->regions[1].size = 1;
          dev_local->regions[2].memory = (void *)dev->regions[3].size;
          iVar1 = pci_device_map_range
                            (dev,dev->regions[3].base_addr,dev->regions[3].size,1,
                             &dev_local->regions[1].field_0x20);
          if (iVar1 != 0) {
            *(undefined8 *)&dev_local->regions[1].field_0x20 = 0;
          }
        }
      }
      else {
        *(undefined4 *)&dev_local->regions[1].size = 1;
        dev_local->regions[2].memory = (void *)dev->regions[2].size;
        iVar1 = pci_device_map_range
                          (dev,dev->regions[2].base_addr,dev->regions[2].size,1,
                           &dev_local->regions[1].field_0x20);
        if (iVar1 != 0) {
          *(undefined8 *)&dev_local->regions[1].field_0x20 = 0;
        }
      }
      pci_device_map_legacy(dev,0,0x100000,1,&dev_local->regions[2].size);
      uVar2 = pci_legacy_open_io(dev,0,0x10000);
      *(undefined8 *)&dev_local->regions[2].field_0x20 = uVar2;
      local_28 = -1;
      if ((dev->regions[2].size != 0) && ((dev->regions[2].field_0x20 & 1) != 0)) {
        local_28 = 2;
      }
      if ((dev->regions[5].size != 0) && ((dev->regions[5].field_0x20 & 1) != 0)) {
        local_28 = 5;
      }
      if (local_28 != -1) {
        pVar3 = pci_device_open_io(dev,dev->regions[local_28].base_addr,dev->regions[local_28].size)
        ;
        dev_local->regions[2].bus_addr = pVar3;
        dev_local->regions[2].base_addr = dev->regions[local_28].size;
      }
      pmc_id_00 = nva_grd32((void *)dev_local->regions[0].size,0);
      parse_pmc_id(pmc_id_00,(chipset_info *)&dev_local->device_class);
    }
    else {
      fprintf(_stderr,"WARN: Can\'t probe %04x:%02x:%02x.%x\n",(ulong)dev->domain,(ulong)dev->bus,
              (ulong)dev->dev,(ulong)dev->func);
      free(dev_local);
      dev_local = (pci_device *)0x0;
    }
  }
  return (nva_card *)dev_local;
}

Assistant:

struct nva_card *nva_init_gpu(struct pci_device *dev) {
	struct nva_card *card = calloc(sizeof *card, 1);
	if (!card)
		return 0;
	card->type = NVA_DEVICE_GPU;
	card->bus_type = NVA_BUS_PCI;
	card->bus.pci = dev;
	int ret = pci_device_map_range(dev, dev->regions[0].base_addr, dev->regions[0].size, PCI_DEV_MAP_FLAG_WRITABLE, &card->bar0);
	if (ret) {
		fprintf (stderr, "WARN: Can't probe %04x:%02x:%02x.%x\n", dev->domain, dev->bus, dev->dev, dev->func);
		free(card);
		return 0;
	}
	card->bar0len = dev->regions[0].size;
	if (dev->regions[1].size) {
		card->hasbar1 = 1;
		card->bar1len = dev->regions[1].size;
		ret = pci_device_map_range(dev, dev->regions[1].base_addr, dev->regions[1].size, PCI_DEV_MAP_FLAG_WRITABLE, &card->bar1);
		if (ret) {
			card->bar1 = 0;
		}
	}
	if (dev->regions[2].size && !dev->regions[2].is_IO) {
		card->hasbar2 = 1;
		card->bar2len = dev->regions[2].size;
		ret = pci_device_map_range(dev, dev->regions[2].base_addr, dev->regions[2].size, PCI_DEV_MAP_FLAG_WRITABLE, &card->bar2);
		if (ret) {
			card->bar2 = 0;
		}
	} else if (dev->regions[3].size) {
		card->hasbar2 = 1;
		card->bar2len = dev->regions[3].size;
		ret = pci_device_map_range(dev, dev->regions[3].base_addr, dev->regions[3].size, PCI_DEV_MAP_FLAG_WRITABLE, &card->bar2);
		if (ret) {
			card->bar2 = 0;
		}
	}
	/* ignore errors */
	pci_device_map_legacy(dev, 0, 0x100000, PCI_DEV_MAP_FLAG_WRITABLE, &card->rawmem);
	card->rawio = pci_legacy_open_io(dev, 0, 0x10000);
	int iobar = -1;
	if (dev->regions[2].size && dev->regions[2].is_IO)
		iobar = 2;
	if (dev->regions[5].size && dev->regions[5].is_IO)
		iobar = 5;
	if (iobar != -1) {
		card->iobar = pci_device_open_io(dev, dev->regions[iobar].base_addr, dev->regions[iobar].size);
		card->iobarlen = dev->regions[iobar].size;
	}
	uint32_t pmc_id = nva_grd32(card->bar0, 0);
	parse_pmc_id(pmc_id, &card->chipset);
	return card;
}